

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::BackgroundCall(DBImpl *this)

{
  long lVar1;
  bool bVar2;
  atomic<bool> *in_RDI;
  long in_FS_OFFSET;
  MutexLock l;
  DBImpl *in_stack_00000138;
  DBImpl *in_stack_ffffffffffffffb8;
  memory_order in_stack_ffffffffffffffcc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MutexLock::MutexLock((MutexLock *)in_stack_ffffffffffffffb8,(Mutex *)0xd10e86);
  if ((in_RDI[0x218]._M_base._M_i & 1U) == 0) {
    __assert_fail("background_compaction_scheduled_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x2a9,"void leveldb::DBImpl::BackgroundCall()");
  }
  bVar2 = std::atomic<bool>::load(in_RDI,in_stack_ffffffffffffffcc);
  if ((!bVar2) && (bVar2 = Status::ok((Status *)in_stack_ffffffffffffffb8), bVar2)) {
    BackgroundCompaction(in_stack_00000138);
  }
  in_RDI[0x218]._M_base._M_i = false;
  MaybeScheduleCompaction(in_stack_ffffffffffffffb8);
  port::CondVar::SignalAll((CondVar *)in_stack_ffffffffffffffb8);
  MutexLock::~MutexLock((MutexLock *)in_stack_ffffffffffffffb8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void DBImpl::BackgroundCall() {
  MutexLock l(&mutex_);
  assert(background_compaction_scheduled_);
  if (shutting_down_.load(std::memory_order_acquire)) {
    // No more background work when shutting down.
  } else if (!bg_error_.ok()) {
    // No more background work after a background error.
  } else {
    BackgroundCompaction();
  }

  background_compaction_scheduled_ = false;

  // Previous compaction may have produced too many files in a level,
  // so reschedule another compaction if needed.
  MaybeScheduleCompaction();
  background_work_finished_signal_.SignalAll();
}